

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_back.hpp
# Opt level: O0

bind_back_fn<ranges::views::take_fn_&,_long_&> * __thiscall
ranges::bind_back_fn::operator()
          (bind_back_fn<ranges::views::take_fn_&,_long_&> *__return_storage_ptr__,bind_back_fn *this
          ,take_fn *fn,long *arg1)

{
  long *arg1_local;
  take_fn *fn_local;
  bind_back_fn *this_local;
  
  return *(bind_back_fn<ranges::views::take_fn_&,_long_&> **)fn;
}

Assistant:

constexpr auto operator()(Fn && fn, Arg1 && arg1, Args &&... args) const
            -> detail::bind_back_fn<Fn, Arg1, Args...>
        {
#if defined(__GNUC__) && !defined(__clang__) && __GNUC__ <= 5
            using T = typename detail::bind_back_fn<Fn, Arg1, Args...>::tuple_t;
            return {T{(Fn &&) fn, (Arg1 &&) arg1, (Args &&) args...}};
#else
            return {{(Fn &&) fn, (Arg1 &&) arg1, (Args &&) args...}};
#endif
        }